

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_shapes_db(feed_db_t *db,shape_t **records)

{
  int iVar1;
  shape_t *psVar2;
  uchar *__src;
  double dVar3;
  char local_118 [8];
  char qr [97];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  shape_t record;
  shape_t **records_local;
  feed_db_t *db_local;
  
  db_local._4_4_ = count_rows_db(db,"shapes");
  stmt._4_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_118,
           "SELECT shape_id,shape_pt_lat, shape_pt_lon,shape_pt_sequence, shape_dist_traveled FROM `shapes`;"
           ,0x61);
    sqlite3_prepare_v2(db->conn,local_118,-1,(sqlite3_stmt **)(qr + 0x60),(char **)0x0);
    psVar2 = (shape_t *)malloc((long)db_local._4_4_ * 0x70);
    *records = psVar2;
    if (*records == (shape_t *)0x0) {
      sqlite3_finalize(stack0xffffffffffffff50);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(stack0xffffffffffffff50);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_shape((shape_t *)&record_count);
        __src = sqlite3_column_text(stack0xffffffffffffff50,0);
        strcpy((char *)&record_count,(char *)__src);
        dVar3 = sqlite3_column_double(stack0xffffffffffffff50,1);
        record._56_10_ = (BADTYPE)dVar3;
        dVar3 = sqlite3_column_double(stack0xffffffffffffff50,2);
        record._72_10_ = (BADTYPE)dVar3;
        record._88_4_ = sqlite3_column_int(stack0xffffffffffffff50,3);
        record._96_8_ = sqlite3_column_double(stack0xffffffffffffff50,4);
        memcpy(*records + stmt._4_4_,&record_count,0x70);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < db_local._4_4_);
      sqlite3_finalize(stack0xffffffffffffff50);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_shapes_db(feed_db_t *db, shape_t **records) {

    shape_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "shapes");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "shape_id,"
                    "shape_pt_lat, shape_pt_lon,"
                    "shape_pt_sequence, shape_dist_traveled "
                "FROM `shapes`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_shape(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        record.pt_lat = sqlite3_column_double(stmt, 1);
        record.pt_lon = sqlite3_column_double(stmt, 2);
        record.pt_sequence = sqlite3_column_int(stmt, 3);
        record.dist_traveled = sqlite3_column_double(stmt, 4);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}